

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::SPxBasisBase(SPxBasisBase<double> *this,TYPE ttype)

{
  Timer *pTVar1;
  int in_ESI;
  DataArray<soplex::SPxId> *in_RDI;
  Real in_stack_ffffffffffffffb0;
  Real *pRVar2;
  Desc *this_00;
  
  *(undefined ***)in_RDI = &PTR_change_004ec488;
  in_RDI->data = (SPxId *)0x0;
  pRVar2 = &in_RDI->memFactor;
  this_00 = (Desc *)0x3ff3333333333333;
  DataArray<soplex::SPxId>::DataArray
            (in_RDI,(int)((ulong)pRVar2 >> 0x20),(int)pRVar2,in_stack_ffffffffffffffb0);
  DataArray<const_soplex::SVectorBase<double>_*>::DataArray
            ((DataArray<const_soplex::SVectorBase<double>_*> *)in_RDI,(int)((ulong)pRVar2 >> 0x20),
             (int)pRVar2,in_stack_ffffffffffffffb0);
  *(undefined1 *)&in_RDI[2].memFactor = 0;
  in_RDI[3].thesize = 0;
  in_RDI[3].themax = 0;
  *(undefined1 *)&in_RDI[3].data = 0;
  *(undefined4 *)((long)&in_RDI[3].data + 4) = 200;
  in_RDI[3].memFactor = 10.0;
  in_RDI[4].thesize = 0;
  in_RDI[4].themax = 0x40140000;
  in_RDI[4].data = (SPxId *)0x3ff8000000000000;
  *(undefined4 *)&in_RDI[4].memFactor = 0;
  *(undefined4 *)((long)&in_RDI[4].memFactor + 4) = 0;
  in_RDI[5].thesize = 0;
  in_RDI[5].themax = 0;
  *(undefined4 *)&in_RDI[5].data = 0;
  *(undefined4 *)((long)&in_RDI[5].data + 4) = 1;
  *(undefined4 *)&in_RDI[5].memFactor = 0;
  in_RDI[6].thesize = 0;
  in_RDI[6].themax = 0;
  *(undefined4 *)&in_RDI[6].data = 0;
  in_RDI[6].memFactor = 0.0;
  in_RDI[7].thesize = in_ESI;
  SPxId::SPxId((SPxId *)0x239878);
  SPxId::SPxId((SPxId *)0x23988b);
  *(undefined4 *)((long)&in_RDI[7].memFactor + 4) = 0;
  in_RDI[8].thesize = 0;
  in_RDI[8].themax = 0;
  *(undefined4 *)&in_RDI[8].data = 0xfffffffe;
  Desc::Desc(this_00);
  *(undefined1 *)&in_RDI[0xb].data = 0;
  in_RDI[0xb].memFactor = 0.0;
  pTVar1 = TimerFactory::createTimer((TYPE)((ulong)this_00 >> 0x20));
  in_RDI[6].memFactor = (Real)pTVar1;
  return;
}

Assistant:

SPxBasisBase<R>::SPxBasisBase(Timer::TYPE ttype)
   : theLP(nullptr)
   , matrixIsSetup(false)
   , factor(nullptr)
   , factorized(false)
   , maxUpdates(200)
   , nonzeroFactor(10.0)
   , fillFactor(5.0)
   , memFactor(1.5)
   , iterCount(0)
   , lastIterCount(0)
   , iterDegenCheck(0)
   , updateCount(0)
   , totalUpdateCount(0)
   , nzCount(1)
   , lastMem(0)
   , lastFill(0)
   , lastNzCount(0)
   , theTime(nullptr)
   , timerType(ttype)
   , lastidx(0)
   , minStab(0.0)
   , thestatus(NO_PROBLEM)
   , freeSlinSolver(false)
   , spxout(nullptr)
{
   // info: is not consistent at this moment, e.g. because theLP == 0

   theTime = TimerFactory::createTimer(timerType);
}